

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile-functor.cpp
# Opt level: O1

Tile __thiscall mahjong::NextTile::operator()(NextTile *this,Tile *tile)

{
  Tile TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  TVar1 = *tile;
  iVar2 = ((int)TVar1 / 10) % 10;
  iVar3 = iVar2 + 1;
  iVar4 = iVar3;
  if (8 < iVar2) {
    iVar4 = 1;
  }
  if (299 < TVar1 - 100) {
    iVar4 = iVar3;
  }
  iVar3 = 1;
  if (iVar4 < 5) {
    iVar3 = iVar4;
  }
  if (99 < TVar1 - 400) {
    iVar3 = iVar4;
  }
  iVar4 = 10;
  if (iVar3 < 4) {
    iVar4 = iVar3 * 10;
  }
  if (99 < TVar1 - 500) {
    iVar4 = iVar3 * 10;
  }
  return iVar4 + ((int)TVar1 / 100) * 100;
}

Assistant:

Tile NextTile::operator()(const Tile& tile) const
{
	auto code = static_cast<int>(tile);
	auto suit = code / 100;
	auto number = code / 10 % 10;

	number++;

	if (1 <= suit && suit <= 3 && 9 < number) number = 1;
	if (4 == suit && 4 < number) number = 1;
	if (5 == suit && 3 < number) number = 1;

	auto next = suit * 100 + number * 10;
	return static_cast<Tile>(next);
}